

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O1

_Bool similar_signatures(char *sig1,char *sig2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  do {
    iVar1 = base64_decode(sig1[lVar5]);
    iVar2 = base64_decode(sig2[lVar5]);
    uVar4 = iVar1 - iVar2;
    uVar3 = -uVar4;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
  } while ((uVar3 < 2) && (bVar6 = lVar5 != 0x50, lVar5 = lVar5 + 1, bVar6));
  return uVar3 < 2;
}

Assistant:

static bool similar_signatures(char const sig1[SIG_LEN], char const sig2[SIG_LEN])
{
   int correct = 0;
   int i;

   for (i = 0; i < SIG_LEN; i++) {
      int q1 = base64_decode(sig1[i]);
      int q2 = base64_decode(sig2[i]);

      /* A difference of one quantisation level could be because two values
       * which were originally close by straddled a quantisation boundary.
       * A difference of two quantisation levels is a significant deviation.
       */
      if (abs(q1 - q2) > 1)
         return false;

      correct++;
   }

   return ((float)correct / SIG_LEN) > 0.95;
}